

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O2

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_install_snapshot_req(raft_server *this,req_msg *req)

{
  int iVar1;
  long *plVar2;
  log_entry *this_00;
  ulong args;
  _func_int **pp_Var3;
  long lVar4;
  element_type *peVar5;
  bool bVar6;
  buffer *buf;
  size_t sVar7;
  char *pcVar8;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  ptr<resp_msg> pVar10;
  allocator<char> local_119;
  ptr<snapshot_sync_req> sync_req;
  int local_108 [8];
  undefined1 local_e8 [200];
  char *local_20;
  
  if ((*(element_type **)(in_RDX + 8) ==
       ((req[3].log_entries_.
         super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->
       super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) &&
     (*(char *)((long)&req->last_log_idx_ + 2) == '\0')) {
    iVar1 = *(int *)&req[3].log_entries_.
                     super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    if (iVar1 == 2) {
      become_follower((raft_server *)req);
    }
    else {
      if (iVar1 == 3) {
        plVar2 = (long *)req[4].last_log_term_;
        local_20 = 
        "Receive InstallSnapshotRequest from another leader(%d) with same term, there must be a bug, server exits"
        ;
        pcVar8 = strfmt<200>::fmt<int>((strfmt<200> *)local_e8,*(int *)(in_RDX + 0x14));
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_108,pcVar8,(allocator<char> *)&sync_req);
        (**(code **)(*plVar2 + 0x28))(plVar2,local_108);
        std::__cxx11::string::~string((string *)local_108);
        peVar5 = (((req->log_entries_).
                   super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (**(code **)(peVar5->term_ + 0x40))(peVar5,0xffffffff);
        exit(-1);
      }
      restart_election_timer((raft_server *)req);
    }
  }
  local_e8._0_8_ =
       ((req[3].log_entries_.
         super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->
       super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_108[0] = 0x11;
  sync_req.super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
  _0_4_ = *(undefined4 *)(in_RDX + 0x14);
  std::make_shared<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int>
            ((unsigned_long *)this,(msg_type *)local_e8,local_108,
             (int *)((long)&(req->super_msg_base).term_ + 4));
  if ((*(char *)((long)&req->last_log_idx_ + 2) == '\0') &&
     (*(element_type **)(in_RDX + 8) <
      ((req[3].log_entries_.
        super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)) {
    plVar2 = (long *)req[4].last_log_term_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,
               "received an install snapshot request which has lower term than this server, decline the request"
               ,(allocator<char> *)local_108);
    (**(code **)(*plVar2 + 0x18))(plVar2,local_e8);
  }
  else {
    if ((*(long *)(in_RDX + 0x40) - (long)*(undefined8 **)(in_RDX + 0x38) == 0x10) &&
       (this_00 = (log_entry *)**(undefined8 **)(in_RDX + 0x38),
       this_00->value_type_ == snp_sync_req)) {
      buf = log_entry::get_buf(this_00);
      snapshot_sync_req::deserialize((snapshot_sync_req *)&sync_req,buf);
      args = ((((snapshot_sync_req *)
               CONCAT44(sync_req.
                        super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._4_4_,
                        sync_req.
                        super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._0_4_))->snapshot_).
              super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             last_log_idx_;
      if (req->last_log_term_ < args) {
        bVar6 = handle_snapshot_sync_req
                          ((raft_server *)req,
                           (snapshot_sync_req *)
                           CONCAT44(sync_req.
                                    super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr._4_4_,
                                    sync_req.
                                    super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr._0_4_));
        if (bVar6) {
          pp_Var3 = this->_vptr_raft_server;
          lVar4 = *(long *)(CONCAT44(sync_req.
                                     super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._4_4_,
                                     sync_req.
                                     super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._0_4_) + 0x10);
          sVar7 = buffer::size(*(buffer **)
                                (CONCAT44(sync_req.
                                          super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr._4_4_,
                                          sync_req.
                                          super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr._0_4_) + 0x20));
          pp_Var3[4] = (_func_int *)(sVar7 + lVar4);
          *(undefined1 *)(pp_Var3 + 5) = 1;
        }
      }
      else {
        plVar2 = (long *)req[4].last_log_term_;
        local_e8._104_8_ = "received a snapshot (%llu) that is older than current log store";
        pcVar8 = strfmt<100>::fmt<unsigned_long>((strfmt<100> *)local_e8,args);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_108,pcVar8,&local_119);
        (**(code **)(*plVar2 + 0x20))(plVar2,local_108);
        std::__cxx11::string::~string((string *)local_108);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sync_req.
                  super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      _Var9._M_pi = extraout_RDX_00;
      goto LAB_00145d14;
    }
    plVar2 = (long *)req[4].last_log_term_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,
               "Receive an invalid InstallSnapshotRequest due to bad log entries or bad log entry value"
               ,(allocator<char> *)local_108);
    (**(code **)(*plVar2 + 0x20))(plVar2,local_e8);
  }
  std::__cxx11::string::~string((string *)local_e8);
  _Var9._M_pi = extraout_RDX;
LAB_00145d14:
  pVar10.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  pVar10.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar10.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_install_snapshot_req(req_msg& req)
{
    if (req.get_term() == state_->get_term() && !catching_up_)
    {
        if (role_ == srv_role::candidate)
        {
            become_follower();
        }
        else if (role_ == srv_role::leader)
        {
            l_->err(lstrfmt("Receive InstallSnapshotRequest from another leader(%d) with same term, there must be a "
                            "bug, server exits")
                        .fmt(req.get_src()));
            ctx_->state_mgr_->system_exit(-1);
            ::exit(-1);
            return ptr<resp_msg>();
        }
        else
        {
            restart_election_timer();
        }
    }

    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::install_snapshot_response, id_, req.get_src()));
    if (!catching_up_ && req.get_term() < state_->get_term())
    {
        l_->info("received an install snapshot request which has lower term than this server, decline the request");
        return resp;
    }

    std::vector<ptr<log_entry>>& entries(req.log_entries());
    if (entries.size() != 1 || entries[0]->get_val_type() != log_val_type::snp_sync_req)
    {
        l_->warn("Receive an invalid InstallSnapshotRequest due to bad log entries or bad log entry value");
        return resp;
    }

    ptr<snapshot_sync_req> sync_req(snapshot_sync_req::deserialize(entries[0]->get_buf()));
    if (sync_req->get_snapshot().get_last_log_idx() <= sm_commit_index_)
    {
        l_->warn(sstrfmt("received a snapshot (%llu) that is older than current log store")
                     .fmt(sync_req->get_snapshot().get_last_log_idx()));
        return resp;
    }

    if (handle_snapshot_sync_req(*sync_req))
    {
        resp->accept(sync_req->get_offset() + sync_req->get_data().size());
    }

    return resp;
}